

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void validateWorld(World *world)

{
  Material *pMVar1;
  __uniq_ptr_data<pm::Geometry,_std::default_delete<pm::Geometry>,_true,_true> *p_Var2;
  pointer puVar3;
  pointer puVar4;
  char *pcVar5;
  
  if ((world->viewplane_).samplerState_.sampler_ == (Sampler *)0x0) {
    pcVar5 = "Missing viewplane sampler!\n";
  }
  else {
    puVar3 = (world->objects_).
             super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar3 == (world->objects_).
                    super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        puVar4 = (world->materials_).
                 super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0010cc11;
      }
      p_Var2 = &puVar3->_M_t;
      puVar3 = puVar3 + 1;
    } while (((p_Var2->super___uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_>)._M_t
              .super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
              super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl)->material_ !=
             (Material *)0x0);
    pcVar5 = "Missing material!\n";
  }
LAB_0010cca3:
  std::operator<<((ostream *)&std::cout,pcVar5);
  exit(1);
LAB_0010cc11:
  if (puVar4 == (world->materials_).
                super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  pMVar1 = (puVar4->_M_t).super___uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_>.
           _M_t.super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
           super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl;
  if (pMVar1->type_ == PHONG) {
    if (*(long *)&pMVar1[2].type_ == 0) {
      pcVar5 = "Missing ambient sampler from phong material!\n";
      goto LAB_0010cca3;
    }
    if (*(long *)&pMVar1[5].type_ == 0) {
      pcVar5 = "Missing diffuse sampler from phong material!\n";
      goto LAB_0010cca3;
    }
    if (*(long *)&pMVar1[8].type_ == 0) {
      pcVar5 = "Missing specular sampler from phong material!\n";
      goto LAB_0010cca3;
    }
  }
  else if (pMVar1->type_ == MATTE) {
    if (*(long *)&pMVar1[2].type_ == 0) {
      pcVar5 = "Missing ambient sampler from matte material!\n";
      goto LAB_0010cca3;
    }
    if (*(long *)&pMVar1[5].type_ == 0) {
      pcVar5 = "Missing diffuse sampler from matte material!\n";
      goto LAB_0010cca3;
    }
  }
  puVar4 = puVar4 + 1;
  goto LAB_0010cc11;
}

Assistant:

void validateWorld(const pm::World &world)
{
	if (world.viewPlane().samplerState().sampler() == nullptr)
	{
		std::cout << "Missing viewplane sampler!\n";
		exit(EXIT_FAILURE);
	}

	for (const auto &object : world.objects())
	{
		if (object->material() == nullptr)
		{
			std::cout << "Missing material!\n";
			exit(EXIT_FAILURE);
		}
	}

	for (const auto &material : world.materials())
	{
		if (material->type() == pm::Material::Type::MATTE)
		{
			const pm::Matte *matte = static_cast<pm::Matte *>(material.get());
			if (matte->ambient().sampler() == nullptr)
			{
				std::cout << "Missing ambient sampler from matte material!\n";
				exit(EXIT_FAILURE);
			}
			else if (matte->diffuse().sampler() == nullptr)
			{
				std::cout << "Missing diffuse sampler from matte material!\n";
				exit(EXIT_FAILURE);
			}
		}
		else if (material->type() == pm::Material::Type::PHONG)
		{
			const pm::Phong *phong = static_cast<pm::Phong *>(material.get());
			if (phong->ambient().sampler() == nullptr)
			{
				std::cout << "Missing ambient sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
			else if (phong->diffuse().sampler() == nullptr)
			{
				std::cout << "Missing diffuse sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
			else if (phong->specular().sampler() == nullptr)
			{
				std::cout << "Missing specular sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
		}
	}
}